

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int register_CE(archive_read *a,int32_t location,file_info *file)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long *plVar4;
  void *__dest;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long in_RDX;
  int in_ESI;
  archive *in_RDI;
  int new_size;
  int parent;
  int hole;
  uint64_t parent_offset;
  uint64_t offset;
  read_ce_req *p;
  read_ce_queue *heap;
  iso9660 *iso9660;
  int local_54;
  int local_4c;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  uVar3 = (long)in_ESI * *(long *)(lVar1 + 0xa8);
  if (((((*(uint *)(in_RDX + 0x88) & 0xf000) == 0x8000) && (*(ulong *)(in_RDX + 0x30) <= uVar3)) ||
      (uVar3 < *(ulong *)(lVar1 + 0xa0))) ||
     ((*(ulong *)(lVar1 + 0xa8) < (ulong)*(uint *)(in_RDX + 0x40) + (ulong)*(uint *)(in_RDX + 0x44)
      || (*(ulong *)(lVar1 + 0xb0) <
          uVar3 + *(uint *)(in_RDX + 0x40) + (ulong)*(uint *)(in_RDX + 0x44))))) {
    archive_set_error(in_RDI,-1,"Invalid parameter in SUSP \"CE\" extension");
    return -0x1e;
  }
  plVar4 = (long *)(lVar1 + 0x38);
  if (*(int *)(lVar1 + 0x44) <= *(int *)(lVar1 + 0x40)) {
    if (*(int *)(lVar1 + 0x44) < 0x10) {
      local_54 = 0x10;
    }
    else {
      local_54 = *(int *)(lVar1 + 0x44) << 1;
    }
    if (local_54 <= *(int *)(lVar1 + 0x44)) {
      archive_set_error(in_RDI,0xc,"Out of memory");
      return -0x1e;
    }
    __dest = calloc((long)local_54,0x10);
    if (__dest == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Out of memory");
      return -0x1e;
    }
    if (*plVar4 != 0) {
      memcpy(__dest,(void *)*plVar4,(long)*(int *)(lVar1 + 0x40) << 4);
      free((void *)*plVar4);
    }
    *plVar4 = (long)__dest;
    *(int *)(lVar1 + 0x44) = local_54;
  }
  local_4c = *(int *)(lVar1 + 0x40);
  *(int *)(lVar1 + 0x40) = local_4c + 1;
  while( true ) {
    if (local_4c < 1) {
      *(ulong *)*plVar4 = uVar3;
      *(long *)(*plVar4 + 8) = in_RDX;
      return 0;
    }
    iVar2 = (local_4c + -1) / 2;
    if (*(ulong *)(*plVar4 + (long)iVar2 * 0x10) <= uVar3) break;
    puVar5 = (undefined8 *)(*plVar4 + (long)local_4c * 0x10);
    puVar6 = (undefined8 *)(*plVar4 + (long)iVar2 * 0x10);
    *puVar5 = *puVar6;
    puVar5[1] = puVar6[1];
    local_4c = iVar2;
  }
  *(ulong *)(*plVar4 + (long)local_4c * 0x10) = uVar3;
  *(long *)(*plVar4 + (long)local_4c * 0x10 + 8) = in_RDX;
  return 0;
}

Assistant:

static int
register_CE(struct archive_read *a, int32_t location,
    struct file_info *file)
{
	struct iso9660 *iso9660;
	struct read_ce_queue *heap;
	struct read_ce_req *p;
	uint64_t offset, parent_offset;
	int hole, parent;

	iso9660 = (struct iso9660 *)(a->format->data);
	offset = ((uint64_t)location) * (uint64_t)iso9660->logical_block_size;
	if (((file->mode & AE_IFMT) == AE_IFREG &&
	    offset >= file->offset) ||
	    offset < iso9660->current_position ||
	    (((uint64_t)file->ce_offset) + file->ce_size)
	      > (uint64_t)iso9660->logical_block_size ||
	    offset + file->ce_offset + file->ce_size
		  > iso9660->volume_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid parameter in SUSP \"CE\" extension");
		return (ARCHIVE_FATAL);
	}

	/* Expand our CE list as necessary. */
	heap = &(iso9660->read_ce_req);
	if (heap->cnt >= heap->allocated) {
		int new_size;

		if (heap->allocated < 16)
			new_size = 16;
		else
			new_size = heap->allocated * 2;
		/* Overflow might keep us from growing the list. */
		if (new_size <= heap->allocated) {
			archive_set_error(&a->archive, ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		p = calloc(new_size, sizeof(p[0]));
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		if (heap->reqs != NULL) {
			memcpy(p, heap->reqs, heap->cnt * sizeof(*p));
			free(heap->reqs);
		}
		heap->reqs = p;
		heap->allocated = new_size;
	}

	/*
	 * Start with hole at end, walk it up tree to find insertion point.
	 */
	hole = heap->cnt++;
	while (hole > 0) {
		parent = (hole - 1)/2;
		parent_offset = heap->reqs[parent].offset;
		if (offset >= parent_offset) {
			heap->reqs[hole].offset = offset;
			heap->reqs[hole].file = file;
			return (ARCHIVE_OK);
		}
		/* Move parent into hole <==> move hole up tree. */
		heap->reqs[hole] = heap->reqs[parent];
		hole = parent;
	}
	heap->reqs[0].offset = offset;
	heap->reqs[0].file = file;
	return (ARCHIVE_OK);
}